

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLMaterialRenderer.h
# Opt level: O3

void __thiscall
irr::video::COpenGLMaterialRenderer_ONETEXTURE_BLEND::OnSetMaterial
          (COpenGLMaterialRenderer_ONETEXTURE_BLEND *this,SMaterial *material,
          SMaterial *lastMaterial,bool resetAllRenderstates,IMaterialRendererServices *services)

{
  f32 fVar1;
  COpenGLDriver *this_00;
  long lVar2;
  COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
  *this_01;
  char cVar3;
  uint uVar4;
  code *pcVar5;
  GLenum sourceAlpha;
  undefined7 in_register_00000009;
  GLenum destination;
  undefined8 uVar6;
  u32 state;
  GLenum GVar7;
  undefined8 uVar8;
  long *plVar9;
  GLenum destinationAlpha;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  this_00 = *(COpenGLDriver **)&(this->super_IMaterialRenderer).field_0x8;
  this_00->FixedPipelineState = (uint)(this_00->FixedPipelineState == EOFPS_DISABLE) * 3;
  COpenGLDriver::disableTextures(this_00,1);
  plVar9 = *(long **)&(this->super_IMaterialRenderer).field_0x8;
  (**(code **)(*plVar9 + 0x3c0))
            (plVar9,material,lastMaterial,
             CONCAT71(in_register_00000009,resetAllRenderstates) & 0xffffffff);
  fVar1 = material->MaterialTypeParam;
  uVar10 = (uint)fVar1 >> 4 & 0xf;
  plVar9 = *(long **)&(this->super_IMaterialRenderer).field_0x8;
  lVar2 = plVar9[0x17d];
  if ((**(char **)(lVar2 + 0x78) == '\0') || (*(char *)(lVar2 + 0x82) == '\x01')) {
    (*GL.Enable)(0xbe2);
    if ((ulong)*(uint *)(lVar2 + 0x48) != 0) {
      memset(*(void **)(lVar2 + 0x78),1,(ulong)*(uint *)(lVar2 + 0x48));
    }
    *(undefined1 *)(lVar2 + 0x82) = 0;
    plVar9 = *(long **)&(this->super_IMaterialRenderer).field_0x8;
  }
  uVar13 = (uint)fVar1 >> 0xc & 0xf;
  uVar11 = (uint)fVar1 >> 8 & 0xf;
  uVar12 = (uint)fVar1 & 0xf;
  cVar3 = (**(code **)(*plVar9 + 0x10))(plVar9,0x22);
  this_01 = *(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
              **)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8);
  uVar4 = uVar10 - 1;
  destination = 0;
  if (cVar3 == '\0') {
    GVar7 = 0;
    if (uVar4 < 10) {
      GVar7 = *(GLenum *)(&DAT_0023064c + (ulong)uVar4 * 4);
    }
    if (uVar12 - 1 < 10) {
      destination = *(GLenum *)(&DAT_0023064c + (ulong)(uVar12 - 1) * 4);
    }
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlendFunc(this_01,GVar7,destination);
  }
  else {
    GVar7 = 0;
    if (uVar4 < 10) {
      GVar7 = *(GLenum *)(&DAT_0023064c + (ulong)uVar4 * 4);
    }
    if (uVar12 - 1 < 10) {
      destination = *(GLenum *)(&DAT_0023064c + (ulong)(uVar12 - 1) * 4);
    }
    uVar4 = uVar13 - 1;
    destinationAlpha = 0;
    sourceAlpha = 0;
    if (uVar4 < 10) {
      sourceAlpha = *(GLenum *)(&DAT_0023064c + (ulong)uVar4 * 4);
    }
    uVar4 = uVar11 - 1;
    if (uVar4 < 10) {
      destinationAlpha = *(GLenum *)(&DAT_0023064c + (ulong)uVar4 * 4);
    }
    COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
    ::setBlendFuncSeparate(this_01,GVar7,destination,sourceAlpha,destinationAlpha);
  }
  lVar2 = *(long *)(*(long *)&(this->super_IMaterialRenderer).field_0x8 + 0xbe8);
  if (*(int *)(lVar2 + 0xac) != 0x84c0) {
    pcVar5 = *(code **)(*(long *)(lVar2 + 8) + 0x6c8);
    if ((pcVar5 != (code *)0x0) ||
       (pcVar5 = *(code **)(*(long *)(lVar2 + 8) + 0x6d0), pcVar5 != (code *)0x0)) {
      (*pcVar5)(0x84c0);
    }
    *(undefined4 *)(lVar2 + 0xac) = 0x84c0;
  }
  glTexEnvi(0x2300,0x2200,0x8570);
  glTexEnvi(0x2300,0x8571,0x2100);
  glTexEnvi(0x2300,0x8580,0x1702);
  glTexEnvi(0x2300,0x8581,0x8578);
  glTexEnvf((float)((uint)fVar1 >> 0x10 & 0xf),0x2300,0x8573);
  if ((((4 < uVar10 - 6) && (4 < uVar12 - 6)) && (4 < uVar13 - 6)) && (4 < uVar11 - 6)) {
    return;
  }
  uVar10 = (uint)fVar1 >> 0x14 & 0xf;
  if (uVar10 == 2) {
    glTexEnvi(0x2300,0x8572,0x1e01);
    uVar8 = 0x8588;
  }
  else {
    if (uVar10 == 1) {
      glTexEnvi(0x2300,0x8572,0x1e01);
      uVar8 = 0x8588;
      uVar6 = 0x8577;
      goto LAB_001e87ef;
    }
    glTexEnvi(0x2300,0x8572,0x2100);
    glTexEnvi(0x2300,0x8588,0x8577);
    uVar8 = 0x8589;
  }
  uVar6 = 0x1702;
LAB_001e87ef:
  glTexEnvi(0x2300,uVar8,uVar6);
  return;
}

Assistant:

virtual void OnSetMaterial(const SMaterial &material, const SMaterial &lastMaterial,
			bool resetAllRenderstates, IMaterialRendererServices *services) override
	{
		if (Driver->getFixedPipelineState() == COpenGLDriver::EOFPS_DISABLE)
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_DISABLE_TO_ENABLE);
		else
			Driver->setFixedPipelineState(COpenGLDriver::EOFPS_ENABLE);

		Driver->disableTextures(1);
		Driver->setBasicRenderStates(material, lastMaterial, resetAllRenderstates);

		//		if (material.MaterialType != lastMaterial.MaterialType ||
		//			material.MaterialTypeParam != lastMaterial.MaterialTypeParam ||
		//			resetAllRenderstates)
		{
			E_BLEND_FACTOR srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact;
			E_MODULATE_FUNC modulate;
			u32 alphaSource;
			unpack_textureBlendFuncSeparate(srcRGBFact, dstRGBFact, srcAlphaFact, dstAlphaFact, modulate, alphaSource, material.MaterialTypeParam);

			Driver->getCacheHandler()->setBlend(true);

			if (Driver->queryFeature(EVDF_BLEND_SEPARATE)) {
				Driver->getCacheHandler()->setBlendFuncSeparate(Driver->getGLBlend(srcRGBFact), Driver->getGLBlend(dstRGBFact),
						Driver->getGLBlend(srcAlphaFact), Driver->getGLBlend(dstAlphaFact));
			} else {
				Driver->getCacheHandler()->setBlendFunc(Driver->getGLBlend(srcRGBFact), Driver->getGLBlend(dstRGBFact));
			}

			Driver->getCacheHandler()->setActiveTexture(GL_TEXTURE0_ARB);

#ifdef GL_ARB_texture_env_combine
			glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE_ARB);
			glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB_ARB, GL_MODULATE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB_ARB, GL_TEXTURE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_ARB, GL_PREVIOUS_ARB);
			glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_ARB, (f32)modulate);
#else
			glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_COMBINE_EXT);
			glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_RGB_EXT, GL_MODULATE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_RGB_EXT, GL_TEXTURE);
			glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_RGB_EXT, GL_PREVIOUS_EXT);
			glTexEnvf(GL_TEXTURE_ENV, GL_RGB_SCALE_EXT, (f32)modulate);
#endif

			if (textureBlendFunc_hasAlpha(srcRGBFact) || textureBlendFunc_hasAlpha(dstRGBFact) ||
					textureBlendFunc_hasAlpha(srcAlphaFact) || textureBlendFunc_hasAlpha(dstAlphaFact)) {
				if (alphaSource == EAS_VERTEX_COLOR) {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_PRIMARY_COLOR_ARB);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_PRIMARY_COLOR_EXT);
#endif
				} else if (alphaSource == EAS_TEXTURE) {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_TEXTURE);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_REPLACE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_TEXTURE);
#endif
				} else {
#ifdef GL_ARB_texture_env_combine
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_ARB, GL_MODULATE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_ARB, GL_PRIMARY_COLOR_ARB);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA_ARB, GL_TEXTURE);
#else
					glTexEnvi(GL_TEXTURE_ENV, GL_COMBINE_ALPHA_EXT, GL_MODULATE);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE0_ALPHA_EXT, GL_PRIMARY_COLOR_EXT);
					glTexEnvi(GL_TEXTURE_ENV, GL_SOURCE1_ALPHA_EXT, GL_TEXTURE);
#endif
				}
			}
		}
	}